

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::ShaderMatrixCase::init(ShaderMatrixCase *this,EVP_PKEY_CTX *ctx)

{
  ulong *puVar1;
  uint uVar2;
  uint uVar3;
  DataType DVar4;
  MatrixOp op;
  EVP_PKEY_CTX *pEVar5;
  pointer pMVar6;
  OperationType OVar7;
  int iVar8;
  int iVar9;
  DataType DVar10;
  TestMatrixType TVar11;
  char *pcVar12;
  char *pcVar13;
  size_t sVar14;
  undefined8 *puVar15;
  char **ppcVar16;
  long *plVar17;
  string *psVar18;
  ostream *poVar19;
  ostringstream *poVar20;
  DataType DVar21;
  size_type *psVar22;
  undefined4 *puVar23;
  int row;
  int attribNdx;
  int precision;
  long lVar24;
  ulong uVar25;
  undefined8 uVar26;
  ShaderMatrixCase *pSVar27;
  EVP_PKEY_CTX *ctx_00;
  _Alloc_hider _Var28;
  int row_8;
  string *psVar29;
  long lVar30;
  int row_6;
  EVP_PKEY_CTX *pEVar31;
  long lVar32;
  int row_7;
  ulong uVar33;
  long lVar34;
  vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *this_00;
  undefined4 *puVar35;
  pointer pbVar36;
  string *psVar37;
  bool bVar38;
  bool bVar39;
  float fVar40;
  DataType resultType;
  string operationValue0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  passVars;
  string inValue0;
  string inValue1;
  string operationValue1;
  ostringstream s;
  ostringstream vtx;
  ostringstream frag;
  undefined1 auStack_618 [8];
  ostringstream *local_610;
  DataType local_604;
  ShaderMatrixCase *local_600;
  Precision local_5f4;
  string local_5f0;
  string *local_5d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_5c8;
  long local_5c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5b8;
  ulong *local_5a8;
  long local_5a0;
  ulong local_598 [2];
  char *local_588;
  char *local_580;
  char local_578;
  undefined7 uStack_577;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_568;
  char *local_548;
  long local_540;
  undefined4 *local_538;
  undefined4 *local_530;
  undefined4 *local_528;
  undefined4 *local_520;
  undefined4 *local_518;
  undefined4 *local_510;
  undefined4 *local_508;
  undefined4 *local_500;
  char *local_4f8;
  long local_4f0;
  char local_4e8;
  undefined7 uStack_4e7;
  char *local_4d8;
  undefined8 local_4d0;
  char local_4c8;
  undefined7 uStack_4c7;
  char *local_4b8;
  undefined8 local_4b0;
  char local_4a8;
  undefined7 uStack_4a7;
  string local_498;
  ulong local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  ios_base local_428 [264];
  undefined1 local_320 [376];
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  local_610 = (ostringstream *)local_1a8;
  if ((this->super_ShaderRenderCase).m_isVertexCase != false) {
    local_610 = (ostringstream *)local_320;
  }
  DVar10 = (this->m_in0).dataType;
  local_5d0 = (string *)(ulong)DVar10;
  DVar4 = (this->m_in1).dataType;
  uVar2 = DVar4 - TYPE_FLOAT_MAT2;
  uVar3 = DVar4 - TYPE_DOUBLE_MAT2;
  local_4f8 = &local_4e8;
  local_4f0 = 0;
  local_4e8 = '\0';
  local_4d8 = &local_4c8;
  local_4d0 = 0;
  local_4c8 = '\0';
  local_604 = TYPE_LAST;
  local_5f4 = (this->m_in0).precision;
  local_568.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_568.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_568.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  op = this->m_op;
  local_600 = this;
  OVar7 = MatrixCaseUtils::getOperationType(op);
  local_540 = 1;
  if (OVar7 < OPERATIONTYPE_LAST) {
    local_540 = *(long *)(&DAT_01c2e3f0 + (ulong)OVar7 * 8);
  }
  local_588 = &local_578;
  local_580 = (char *)0x0;
  local_578 = '\0';
  local_4b8 = &local_4a8;
  local_4b0 = 0;
  local_4a8 = '\0';
  if (((op == OP_MUL) && (DVar10 - TYPE_FLOAT_MAT2 < 9 || DVar10 - TYPE_DOUBLE_MAT2 < 9)) &&
     (uVar2 < 9 || uVar3 < 9)) {
    iVar8 = glu::getDataTypeMatrixNumColumns(DVar4);
    iVar9 = glu::getDataTypeMatrixNumRows((local_600->m_in0).dataType);
    DVar10 = glu::getDataTypeMatrix(iVar8,iVar9);
  }
  else {
    switch(op) {
    case OP_OUTER_PRODUCT:
      iVar8 = glu::getDataTypeScalarSize(DVar4);
      iVar9 = glu::getDataTypeScalarSize((local_600->m_in0).dataType);
      DVar10 = glu::getDataTypeMatrix(iVar8,iVar9);
      break;
    case OP_TRANSPOSE:
      iVar8 = glu::getDataTypeMatrixNumRows((DataType)local_5d0);
      iVar9 = glu::getDataTypeMatrixNumColumns((local_600->m_in0).dataType);
      DVar10 = glu::getDataTypeMatrix(iVar8,iVar9);
      break;
    case OP_DETERMINANT:
      local_604 = TYPE_FLOAT;
      DVar10 = local_604;
      break;
    default:
      if ((OVar7 & ~OPERATIONTYPE_BINARY_FUNCTION) != OPERATIONTYPE_UNARY_PREFIX_OPERATOR) {
        bVar39 = 8 < DVar10 - TYPE_DOUBLE_MAT2;
        bVar38 = 8 < DVar10 - TYPE_FLOAT_MAT2;
        if ((bVar38 && bVar39) || (8 < uVar2 && 8 < uVar3)) {
          DVar10 = local_604;
          if ((uVar2 < 9 || uVar3 < 9) || (!bVar38 || !bVar39)) {
            DVar4 = (local_600->m_in0).dataType;
            DVar10 = (local_600->m_in1).dataType;
            DVar21 = DVar4;
            if (!bVar38 || !bVar39) {
              DVar21 = DVar10;
              DVar10 = DVar4;
            }
            if (DVar21 != TYPE_FLOAT) {
              if (bVar38 && bVar39) {
                iVar8 = glu::getDataTypeMatrixNumColumns(DVar10);
              }
              else {
                iVar8 = glu::getDataTypeMatrixNumRows(DVar10);
              }
              DVar10 = glu::getDataTypeFloatVec(iVar8);
            }
          }
          break;
        }
      }
    case OP_INVERSE:
      DVar10 = (DataType)local_5d0;
    }
  }
  local_604 = DVar10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"#version 300 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"#version 300 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"in highp vec4 a_position;\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) out mediump vec4 dEQP_FragColor;\n",0x36);
  if ((local_600->super_ShaderRenderCase).m_isVertexCase == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"out mediump vec4 v_color;\n",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"in mediump vec4 v_color;\n",0x19);
  }
  local_500 = &s_constInMat4x4;
  local_508 = &s_constInMat4x3;
  local_510 = &s_constInMat4x2;
  local_518 = &s_constInMat3x4;
  local_520 = &s_constInMat3x3;
  local_528 = &s_constInMat3x2;
  local_530 = &s_constInMat2x4;
  local_538 = &s_constInMat2x3;
  puVar35 = &s_constInMat2x2;
  lVar34 = 0;
  local_548 = ";\n";
  do {
    pSVar27 = local_600;
    lVar24 = 0x134;
    if (lVar34 == 0) {
      lVar24 = 0x128;
    }
    pcVar12 = glu::getPrecisionName
                        (*(Precision *)
                          ((long)&(local_600->super_ShaderRenderCase).super_TestCase.super_TestNode.
                                  m_testCtx + lVar24));
    pcVar13 = glu::getDataTypeName
                        (*(DataType *)
                          ((long)&(pSVar27->super_ShaderRenderCase).super_TestCase.super_TestNode.
                                  _vptr_TestNode + lVar24 + 4));
    local_5d0 = (string *)&local_4d8;
    if (lVar34 == 0) {
      local_5d0 = (string *)&local_4f8;
    }
    iVar8 = *(int *)((long)&(pSVar27->super_ShaderRenderCase).super_TestCase.super_TestNode.
                            _vptr_TestNode + lVar24);
    iVar9 = (int)lVar34;
    if (iVar8 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"const ",6);
      if (pcVar12 == (char *)0x0) {
        std::ios::clear((int)local_610 + (int)*(undefined8 *)(*(long *)local_610 + -0x18));
      }
      else {
        sVar14 = strlen(pcVar12);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,pcVar12,sVar14);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610," ",1);
      if (pcVar13 == (char *)0x0) {
        std::ios::clear((int)local_610 + (int)*(undefined8 *)(*(long *)local_610 + -0x18));
      }
      else {
        sVar14 = strlen(pcVar13);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,pcVar13,sVar14);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610," in",3);
      poVar19 = (ostream *)std::ostream::operator<<(local_610,iVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19," = ",3);
      switch(*(undefined4 *)
              ((long)&(local_600->super_ShaderRenderCase).super_TestCase.super_TestNode.
                      _vptr_TestNode + lVar24 + 4)) {
      case 1:
        de::floatToString_abi_cxx11_
                  (&local_498,(de *)&DAT_00000001,(float)(&s_constInFloat)[lVar34],precision);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_610,local_498._M_dataplus._M_p,local_498._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_dataplus._M_p != &local_498.field_2) {
          operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
        }
        break;
      case 2:
        MatrixCaseUtils::writeVectorConstructor<2>
                  ((ostream *)local_610,(Vector<float,_2> *)(s_constInVec2 + lVar34 * 8));
        break;
      case 3:
        MatrixCaseUtils::writeVectorConstructor<3>
                  ((ostream *)local_610,(Vector<float,_3> *)(s_constInVec3 + lVar34 * 0xc));
        break;
      case 4:
        MatrixCaseUtils::writeVectorConstructor<4>
                  ((ostream *)local_610,(Vector<float,_4> *)(s_constInVec4 + lVar34 * 0x10));
        break;
      case 5:
        local_498._M_dataplus._M_p = (pointer)0x0;
        local_498._M_string_length = 0;
        psVar18 = &local_498;
        puVar23 = puVar35;
        lVar24 = 0;
        do {
          lVar30 = 0;
          do {
            ((Vector<tcu::Vector<float,_2>,_2> *)&psVar18->_M_dataplus)->m_data[lVar30].m_data[0] =
                 (float)puVar23[lVar30];
            lVar30 = lVar30 + 1;
          } while (lVar30 == 1);
          puVar23 = puVar23 + 2;
          psVar18 = (string *)
                    (((Vector<tcu::Vector<float,_2>,_2> *)&psVar18->_M_dataplus)->m_data[0].m_data +
                    1);
          bVar39 = lVar24 == 0;
          lVar24 = lVar24 + 1;
        } while (bVar39);
        MatrixCaseUtils::writeMatrixConstructor<2,2>
                  ((ostream *)local_610,(Matrix<float,_2,_2> *)&local_498);
        break;
      case 6:
        local_498._M_dataplus._M_p = (pointer)0x0;
        local_498._M_string_length = 0;
        local_498.field_2._M_allocated_capacity = 0;
        lVar24 = 0;
        psVar18 = &local_498;
        puVar23 = local_538;
        do {
          lVar30 = 0;
          psVar29 = psVar18;
          do {
            ((Vector<tcu::Vector<float,_3>,_2> *)&psVar29->_M_dataplus)->m_data[0].m_data[0] =
                 (float)puVar23[lVar30];
            lVar30 = lVar30 + 1;
            psVar29 = (string *)((long)&psVar29->_M_string_length + 4);
          } while (lVar30 == 1);
          lVar24 = lVar24 + 1;
          puVar23 = puVar23 + 2;
          psVar18 = (string *)
                    (((Vector<tcu::Vector<float,_3>,_2> *)&psVar18->_M_dataplus)->m_data[0].m_data +
                    1);
        } while (lVar24 != 3);
        MatrixCaseUtils::writeMatrixConstructor<2,3>
                  ((ostream *)local_610,(Matrix<float,_3,_2> *)&local_498);
        break;
      case 7:
        local_498.field_2._M_allocated_capacity = 0;
        local_498.field_2._8_8_ = 0;
        local_498._M_dataplus._M_p = (pointer)0x0;
        local_498._M_string_length = 0;
        lVar24 = 0;
        psVar18 = &local_498;
        puVar23 = local_530;
        do {
          lVar30 = 0;
          do {
            ((Vector<tcu::Vector<float,_4>,_2> *)&psVar18->_M_dataplus)->m_data[0].m_data[lVar30] =
                 *(float *)((long)puVar23 + lVar30);
            lVar30 = lVar30 + 4;
          } while (lVar30 == 4);
          lVar24 = lVar24 + 1;
          puVar23 = puVar23 + 2;
          psVar18 = (string *)
                    (((Vector<tcu::Vector<float,_4>,_2> *)&psVar18->_M_dataplus)->m_data[0].m_data +
                    1);
        } while (lVar24 != 4);
        MatrixCaseUtils::writeMatrixConstructor<2,4>
                  ((ostream *)local_610,(Matrix<float,_4,_2> *)&local_498);
        break;
      case 8:
        local_498._M_dataplus._M_p = (pointer)0x0;
        local_498._M_string_length = 0;
        local_498.field_2._M_allocated_capacity = 0;
        psVar18 = &local_498;
        puVar23 = local_528;
        lVar24 = 0;
        do {
          lVar30 = 0;
          do {
            ((Vector<tcu::Vector<float,_2>,_3> *)&psVar18->_M_dataplus)->m_data[lVar30].m_data[0] =
                 (float)puVar23[lVar30];
            lVar30 = lVar30 + 1;
          } while (lVar30 != 3);
          puVar23 = puVar23 + 3;
          psVar18 = (string *)
                    (((Vector<tcu::Vector<float,_2>,_3> *)&psVar18->_M_dataplus)->m_data[0].m_data +
                    1);
          bVar39 = lVar24 == 0;
          lVar24 = lVar24 + 1;
        } while (bVar39);
        MatrixCaseUtils::writeMatrixConstructor<3,2>
                  ((ostream *)local_610,(Matrix<float,_2,_3> *)&local_498);
        break;
      case 9:
        local_498.field_2._M_allocated_capacity = 0;
        local_498.field_2._8_8_ = 0;
        local_498._M_dataplus._M_p = (pointer)0x0;
        local_498._M_string_length = 0;
        local_478 = local_478 & 0xffffffff00000000;
        lVar24 = 0;
        psVar18 = &local_498;
        puVar23 = local_520;
        do {
          lVar30 = 0;
          psVar29 = psVar18;
          do {
            ((Vector<tcu::Vector<float,_3>,_3> *)&psVar29->_M_dataplus)->m_data[0].m_data[0] =
                 (float)puVar23[lVar30];
            lVar30 = lVar30 + 1;
            psVar29 = (string *)((long)&psVar29->_M_string_length + 4);
          } while (lVar30 != 3);
          lVar24 = lVar24 + 1;
          puVar23 = puVar23 + 3;
          psVar18 = (string *)
                    (((Vector<tcu::Vector<float,_3>,_3> *)&psVar18->_M_dataplus)->m_data[0].m_data +
                    1);
        } while (lVar24 != 3);
        MatrixCaseUtils::writeMatrixConstructor<3,3>
                  ((ostream *)local_610,(Matrix<float,_3,_3> *)&local_498);
        break;
      case 10:
        local_478 = 0;
        uStack_470 = 0;
        local_498.field_2._M_allocated_capacity = 0;
        local_498.field_2._8_8_ = 0;
        local_498._M_dataplus._M_p = (pointer)0x0;
        local_498._M_string_length = 0;
        lVar24 = 0;
        psVar18 = &local_498;
        puVar23 = local_518;
        do {
          lVar30 = 0;
          do {
            ((Vector<tcu::Vector<float,_4>,_3> *)&psVar18->_M_dataplus)->m_data[0].m_data[lVar30] =
                 *(float *)((long)puVar23 + lVar30);
            lVar30 = lVar30 + 4;
          } while (lVar30 != 0xc);
          lVar24 = lVar24 + 1;
          puVar23 = puVar23 + 3;
          psVar18 = (string *)
                    (((Vector<tcu::Vector<float,_4>,_3> *)&psVar18->_M_dataplus)->m_data[0].m_data +
                    1);
        } while (lVar24 != 4);
        MatrixCaseUtils::writeMatrixConstructor<3,4>
                  ((ostream *)local_610,(Matrix<float,_4,_3> *)&local_498);
        break;
      case 0xb:
        local_498.field_2._M_allocated_capacity = 0;
        local_498.field_2._8_8_ = 0;
        local_498._M_dataplus._M_p = (pointer)0x0;
        local_498._M_string_length = 0;
        psVar18 = &local_498;
        puVar23 = local_510;
        lVar24 = 0;
        do {
          lVar30 = 0;
          do {
            ((Vector<tcu::Vector<float,_2>,_4> *)&psVar18->_M_dataplus)->m_data[lVar30].m_data[0] =
                 (float)puVar23[lVar30];
            lVar30 = lVar30 + 1;
          } while (lVar30 != 4);
          puVar23 = puVar23 + 4;
          psVar18 = (string *)
                    (((Vector<tcu::Vector<float,_2>,_4> *)&psVar18->_M_dataplus)->m_data[0].m_data +
                    1);
          bVar39 = lVar24 == 0;
          lVar24 = lVar24 + 1;
        } while (bVar39);
        MatrixCaseUtils::writeMatrixConstructor<4,2>
                  ((ostream *)local_610,(Matrix<float,_2,_4> *)&local_498);
        break;
      case 0xc:
        local_478 = 0;
        uStack_470 = 0;
        local_498.field_2._M_allocated_capacity = 0;
        local_498.field_2._8_8_ = 0;
        local_498._M_dataplus._M_p = (pointer)0x0;
        local_498._M_string_length = 0;
        lVar24 = 0;
        psVar18 = &local_498;
        puVar23 = local_508;
        do {
          lVar30 = 0;
          psVar29 = psVar18;
          do {
            ((Vector<tcu::Vector<float,_3>,_4> *)&psVar29->_M_dataplus)->m_data[0].m_data[0] =
                 (float)puVar23[lVar30];
            lVar30 = lVar30 + 1;
            psVar29 = (string *)((long)&psVar29->_M_string_length + 4);
          } while (lVar30 != 4);
          lVar24 = lVar24 + 1;
          puVar23 = puVar23 + 4;
          psVar18 = (string *)
                    (((Vector<tcu::Vector<float,_3>,_4> *)&psVar18->_M_dataplus)->m_data[0].m_data +
                    1);
        } while (lVar24 != 3);
        MatrixCaseUtils::writeMatrixConstructor<4,3>
                  ((ostream *)local_610,(Matrix<float,_3,_4> *)&local_498);
        break;
      case 0xd:
        local_468 = 0;
        uStack_460 = 0;
        local_478 = 0;
        uStack_470 = 0;
        local_498.field_2._M_allocated_capacity = 0;
        local_498.field_2._8_8_ = 0;
        local_498._M_dataplus._M_p = (pointer)0x0;
        local_498._M_string_length = 0;
        lVar24 = 0;
        psVar18 = &local_498;
        puVar23 = local_500;
        do {
          lVar30 = 0;
          do {
            ((Vector<tcu::Vector<float,_4>,_4> *)&psVar18->_M_dataplus)->m_data[0].m_data[lVar30] =
                 *(float *)((long)puVar23 + lVar30);
            lVar30 = lVar30 + 4;
          } while (lVar30 != 0x10);
          lVar24 = lVar24 + 1;
          puVar23 = puVar23 + 4;
          psVar18 = (string *)
                    (((Vector<tcu::Vector<float,_4>,_4> *)&psVar18->_M_dataplus)->m_data[0].m_data +
                    1);
        } while (lVar24 != 4);
        MatrixCaseUtils::writeMatrixConstructor<4,4>
                  ((ostream *)local_610,(Matrix<float,_4,_4> *)&local_498);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,";\n",2);
      local_5c8 = &local_5b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c8,"in","");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_498);
      std::ostream::operator<<(&local_498,iVar9);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_498);
      std::ios_base::~ios_base(local_428);
      uVar26 = 0xf;
      if (local_5c8 != &local_5b8) {
        uVar26 = local_5b8._M_allocated_capacity;
      }
      if ((ulong)uVar26 < (ulong)(local_5a0 + local_5c0)) {
        uVar25 = 0xf;
        if (local_5a8 != local_598) {
          uVar25 = local_598[0];
        }
        if ((ulong)(local_5a0 + local_5c0) <= uVar25) {
          puVar15 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_5a8,0,(char *)0x0,(ulong)local_5c8);
          goto LAB_010a9ac0;
        }
      }
      puVar15 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_5c8,(ulong)local_5a8);
LAB_010a9ac0:
      local_5f0._M_dataplus._M_p = (pointer)&local_5f0.field_2;
      puVar1 = puVar15 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar15 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar1) {
        local_5f0.field_2._M_allocated_capacity = *puVar1;
        local_5f0.field_2._8_8_ = puVar15[3];
      }
      else {
        local_5f0.field_2._M_allocated_capacity = *puVar1;
        local_5f0._M_dataplus._M_p = (pointer)*puVar15;
      }
      local_5f0._M_string_length = puVar15[1];
      *puVar15 = puVar1;
      puVar15[1] = 0;
      *(undefined1 *)puVar1 = 0;
      std::__cxx11::string::operator=(local_5d0,(string *)&local_5f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
        operator_delete(local_5f0._M_dataplus._M_p,local_5f0.field_2._M_allocated_capacity + 1);
      }
      if (local_5a8 != local_598) {
        operator_delete(local_5a8,local_598[0] + 1);
      }
      uVar26 = local_5b8._M_allocated_capacity;
      _Var28._M_p = (pointer)local_5c8;
      if (local_5c8 != &local_5b8) {
LAB_010a9b69:
        operator_delete(_Var28._M_p,uVar26 + 1);
      }
    }
    else {
      if (iVar8 == 1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"uniform ",8);
        if (pcVar12 == (char *)0x0) {
          std::ios::clear((int)local_610 + (int)*(undefined8 *)(*(long *)local_610 + -0x18));
        }
        else {
          sVar14 = strlen(pcVar12);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,pcVar12,sVar14);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610," ",1);
        if (pcVar13 == (char *)0x0) {
          std::ios::clear((int)local_610 + (int)*(undefined8 *)(*(long *)local_610 + -0x18));
        }
        else {
          sVar14 = strlen(pcVar13);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,pcVar13,sVar14);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610," u_in",5);
        poVar19 = (ostream *)std::ostream::operator<<(local_610,iVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,";\n",2);
        local_5c8 = &local_5b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c8,"u_in","");
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_498);
        std::ostream::operator<<(&local_498,iVar9);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_498);
        std::ios_base::~ios_base(local_428);
        uVar26 = 0xf;
        if (local_5c8 != &local_5b8) {
          uVar26 = local_5b8._M_allocated_capacity;
        }
        if ((ulong)uVar26 < (ulong)(local_5a0 + local_5c0)) {
          uVar25 = 0xf;
          if (local_5a8 != local_598) {
            uVar25 = local_598[0];
          }
          if ((ulong)(local_5a0 + local_5c0) <= uVar25) {
            puVar15 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_5a8,0,(char *)0x0,(ulong)local_5c8);
            goto LAB_010a9ac0;
          }
        }
        puVar15 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_5c8,(ulong)local_5a8)
        ;
        goto LAB_010a9ac0;
      }
      if (iVar8 == 2) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"in ",3);
        if (pcVar12 == (char *)0x0) {
          std::ios::clear((int)auStack_618 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0x2f8);
        }
        else {
          sVar14 = strlen(pcVar12);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar12,sVar14);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
        if (pcVar13 == (char *)0x0) {
          std::ios::clear((int)auStack_618 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0x2f8);
        }
        else {
          sVar14 = strlen(pcVar13);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar13,sVar14);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," a_",3);
        iVar8 = *(int *)((long)&(local_600->super_ShaderRenderCase).super_TestCase.super_TestNode.
                                _vptr_TestNode + lVar24 + 4);
        if (8 < iVar8 - 5U && 8 < iVar8 - 0x12U) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"coords;\n",8);
          if ((local_600->super_ShaderRenderCase).m_isVertexCase == false) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"out ",4);
            if (pcVar12 == (char *)0x0) {
              std::ios::clear((int)auStack_618 + (int)*(_func_int **)(local_320._0_8_ + -0x18) +
                              0x2f8);
            }
            else {
              sVar14 = strlen(pcVar12);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_320,pcVar12,sVar14);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
            if (pcVar13 == (char *)0x0) {
              std::ios::clear((int)auStack_618 + (int)*(_func_int **)(local_320._0_8_ + -0x18) +
                              0x2f8);
            }
            else {
              sVar14 = strlen(pcVar13);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_320,pcVar13,sVar14);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_320," v_coords;\n",0xb);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"in ",3);
            if (pcVar12 == (char *)0x0) {
              std::ios::clear((int)auStack_618 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) +
                              0x470);
            }
            else {
              sVar14 = strlen(pcVar12);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,pcVar12,sVar14);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
            if (pcVar13 == (char *)0x0) {
              std::ios::clear((int)auStack_618 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) +
                              0x470);
            }
            else {
              sVar14 = strlen(pcVar13);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,pcVar13,sVar14);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8," v_coords;\n",0xb);
            local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"coords","");
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_568,&local_498);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_498._M_dataplus._M_p != &local_498.field_2) {
              operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1
                             );
            }
          }
          pcVar12 = "v_coords";
          if ((local_600->super_ShaderRenderCase).m_isVertexCase != false) {
            pcVar12 = "a_coords";
          }
          ppcVar16 = &local_4d8;
          if (lVar34 == 0) {
            ppcVar16 = &local_4f8;
          }
          std::__cxx11::string::_M_replace((ulong)local_5d0,0,ppcVar16[1],(ulong)pcVar12);
          goto LAB_010a9b71;
        }
        if (pcVar13 == (char *)0x0) {
          std::ios::clear((int)auStack_618 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0x2f8);
        }
        else {
          sVar14 = strlen(pcVar13);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar13,sVar14);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,";\n",2);
        if ((local_600->super_ShaderRenderCase).m_isVertexCase == false) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"out ",4);
          if (pcVar12 == (char *)0x0) {
            std::ios::clear((int)auStack_618 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0x2f8
                           );
          }
          else {
            sVar14 = strlen(pcVar12);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar12,sVar14);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
          if (pcVar13 == (char *)0x0) {
            std::ios::clear((int)auStack_618 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0x2f8
                           );
          }
          else {
            sVar14 = strlen(pcVar13);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar13,sVar14);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," v_",3);
          if (pcVar13 == (char *)0x0) {
            std::ios::clear((int)auStack_618 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0x2f8
                           );
          }
          else {
            sVar14 = strlen(pcVar13);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar13,sVar14);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,";\n",2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"in ",3);
          if (pcVar12 == (char *)0x0) {
            std::ios::clear((int)auStack_618 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x470
                           );
          }
          else {
            sVar14 = strlen(pcVar12);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar12,sVar14);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
          if (pcVar13 == (char *)0x0) {
            std::ios::clear((int)auStack_618 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x470
                           );
          }
          else {
            sVar14 = strlen(pcVar13);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar13,sVar14);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," v_",3);
          if (pcVar13 == (char *)0x0) {
            std::ios::clear((int)auStack_618 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x470
                           );
          }
          else {
            sVar14 = strlen(pcVar13);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar13,sVar14);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n",2);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_498,pcVar13,(allocator<char> *)&local_5f0);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_568
                     ,&local_498);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498._M_dataplus._M_p != &local_498.field_2) {
            operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
          }
        }
        pSVar27 = local_600;
        bVar39 = (local_600->super_ShaderRenderCase).m_isVertexCase != false;
        pcVar12 = "v_";
        if (bVar39) {
          pcVar12 = "a_";
        }
        local_5f0._M_dataplus._M_p = (pointer)&local_5f0.field_2;
        pcVar13 = "";
        if (bVar39) {
          pcVar13 = "";
        }
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f0,pcVar12,pcVar13);
        glu::getDataTypeName
                  (*(DataType *)
                    ((long)&(pSVar27->super_ShaderRenderCase).super_TestCase.super_TestNode.
                            _vptr_TestNode + lVar24 + 4));
        plVar17 = (long *)std::__cxx11::string::append((char *)&local_5f0);
        psVar22 = (size_type *)(plVar17 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar17 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar22) {
          local_498.field_2._M_allocated_capacity = *psVar22;
          local_498.field_2._8_8_ = plVar17[3];
          local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
        }
        else {
          local_498.field_2._M_allocated_capacity = *psVar22;
          local_498._M_dataplus._M_p = (pointer)*plVar17;
        }
        local_498._M_string_length = plVar17[1];
        *plVar17 = (long)psVar22;
        plVar17[1] = 0;
        *(undefined1 *)(plVar17 + 2) = 0;
        std::__cxx11::string::operator=(local_5d0,(string *)&local_498);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_dataplus._M_p != &local_498.field_2) {
          operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
        }
        uVar26 = local_5f0.field_2._M_allocated_capacity;
        _Var28._M_p = local_5f0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5f0._M_dataplus._M_p == &local_5f0.field_2) goto LAB_010a9b71;
        goto LAB_010a9b69;
      }
    }
LAB_010a9b71:
    lVar34 = lVar34 + 1;
    local_500 = local_500 + 0x10;
    local_508 = local_508 + 0xc;
    local_510 = local_510 + 8;
    local_518 = local_518 + 0xc;
    local_520 = local_520 + 9;
    local_528 = local_528 + 6;
    local_530 = local_530 + 8;
    local_538 = local_538 + 6;
    puVar35 = puVar35 + 4;
  } while (lVar34 != local_540);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"\tgl_Position = a_position;\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  if ((local_600->super_ShaderRenderCase).m_isVertexCase == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tdEQP_FragColor = v_color;\n",0x1b);
  }
  else if (local_568.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           local_568.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar36 = local_568.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\tv_",3);
      poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_320,(pbVar36->_M_dataplus)._M_p,
                           pbVar36->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19," = ",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,"a_",2);
      poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar19,(pbVar36->_M_dataplus)._M_p,pbVar36->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,";\n",2);
      pbVar36 = pbVar36 + 1;
    } while (pbVar36 !=
             local_568.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_600->m_op - OP_PRE_INCREMENT < 4) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"\t",1);
    pcVar12 = glu::getPrecisionName(local_5f4);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)local_610 + (int)*(undefined8 *)(*(long *)local_610 + -0x18));
    }
    else {
      sVar14 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,pcVar12,sVar14);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610," ",1);
    pcVar12 = glu::getDataTypeName(local_604);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)local_610 + (int)*(undefined8 *)(*(long *)local_610 + -0x18));
    }
    else {
      sVar14 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,pcVar12,sVar14);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610," tmpValue = ",0xc);
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_610,local_4f8,local_4f0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,";\n",2);
    std::__cxx11::string::_M_replace((ulong)&local_588,0,local_580,0x1bff997);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_588);
  }
  psVar37 = (string *)&local_4b8;
  std::__cxx11::string::_M_assign(psVar37);
  OVar7 = MatrixCaseUtils::getOperationType(local_600->m_op);
  switch(OVar7) {
  case OPERATIONTYPE_BINARY_OPERATOR:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"\t",1);
    pcVar12 = glu::getPrecisionName(local_5f4);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)local_610 + (int)*(undefined8 *)(*(long *)local_610 + -0x18));
    }
    else {
      sVar14 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,pcVar12,sVar14);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610," ",1);
    pcVar12 = glu::getDataTypeName(local_604);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)local_610 + (int)*(undefined8 *)(*(long *)local_610 + -0x18));
    }
    else {
      sVar14 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,pcVar12,sVar14);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610," res = ",7);
    poVar20 = (ostringstream *)
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_610,local_588,(long)local_580);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar20," ",1);
    pcVar12 = MatrixCaseUtils::getOperationName(local_600->m_op);
    sVar14 = strlen(pcVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar20,pcVar12,sVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar20," ",1);
    break;
  case OPERATIONTYPE_BINARY_FUNCTION:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"\t",1);
    pcVar12 = glu::getPrecisionName(local_5f4);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)local_610 + (int)*(undefined8 *)(*(long *)local_610 + -0x18));
    }
    else {
      sVar14 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,pcVar12,sVar14);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610," ",1);
    pcVar12 = glu::getDataTypeName(local_604);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)local_610 + (int)*(undefined8 *)(*(long *)local_610 + -0x18));
    }
    else {
      sVar14 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,pcVar12,sVar14);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610," res = ",7);
    pcVar12 = MatrixCaseUtils::getOperationName(local_600->m_op);
    sVar14 = strlen(pcVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,pcVar12,sVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"(",1);
    poVar20 = (ostringstream *)
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_610,local_588,(long)local_580);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar20,", ",2);
    ppcVar16 = &local_4b8;
    goto LAB_010aa5ad;
  case OPERATIONTYPE_UNARY_PREFIX_OPERATOR:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"\t",1);
    pcVar12 = glu::getPrecisionName(local_5f4);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)local_610 + (int)*(undefined8 *)(*(long *)local_610 + -0x18));
    }
    else {
      sVar14 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,pcVar12,sVar14);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610," ",1);
    pcVar12 = glu::getDataTypeName(local_604);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)local_610 + (int)*(undefined8 *)(*(long *)local_610 + -0x18));
    }
    else {
      sVar14 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,pcVar12,sVar14);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610," res = ",7);
    pcVar12 = MatrixCaseUtils::getOperationName(local_600->m_op);
    sVar14 = strlen(pcVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,pcVar12,sVar14);
    psVar37 = (string *)&local_588;
    poVar20 = local_610;
    break;
  case OPERATIONTYPE_UNARY_POSTFIX_OPERATOR:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"\t",1);
    pcVar12 = glu::getPrecisionName(local_5f4);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)local_610 + (int)*(undefined8 *)(*(long *)local_610 + -0x18));
    }
    else {
      sVar14 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,pcVar12,sVar14);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610," ",1);
    pcVar12 = glu::getDataTypeName(local_604);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)local_610 + (int)*(undefined8 *)(*(long *)local_610 + -0x18));
    }
    else {
      sVar14 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,pcVar12,sVar14);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610," res = ",7);
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_610,local_588,(long)local_580);
    pcVar12 = MatrixCaseUtils::getOperationName(local_600->m_op);
    sVar14 = strlen(pcVar12);
    lVar34 = 2;
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,pcVar12,sVar14);
    goto LAB_010aa6ab;
  case OPERATIONTYPE_UNARY_FUNCTION:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"\t",1);
    pcVar12 = glu::getPrecisionName(local_5f4);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)local_610 + (int)*(undefined8 *)(*(long *)local_610 + -0x18));
    }
    else {
      sVar14 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,pcVar12,sVar14);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610," ",1);
    pcVar12 = glu::getDataTypeName(local_604);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)local_610 + (int)*(undefined8 *)(*(long *)local_610 + -0x18));
    }
    else {
      sVar14 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,pcVar12,sVar14);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610," res = ",7);
    pcVar12 = MatrixCaseUtils::getOperationName(local_600->m_op);
    sVar14 = strlen(pcVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,pcVar12,sVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"(",1);
    ppcVar16 = &local_588;
    poVar20 = local_610;
LAB_010aa5ad:
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar20,*ppcVar16,(long)ppcVar16[1]);
    lVar34 = 3;
    local_548 = ");\n";
    goto LAB_010aa6ab;
  case OPERATIONTYPE_ASSIGNMENT:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"\t",1);
    pcVar12 = glu::getPrecisionName(local_5f4);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)local_610 + (int)*(undefined8 *)(*(long *)local_610 + -0x18));
    }
    else {
      sVar14 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,pcVar12,sVar14);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610," ",1);
    pcVar12 = glu::getDataTypeName(local_604);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)local_610 + (int)*(undefined8 *)(*(long *)local_610 + -0x18));
    }
    else {
      sVar14 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,pcVar12,sVar14);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610," res = ",7);
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_610,local_588,(long)local_580);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,";\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"\tres ",5);
    pcVar12 = MatrixCaseUtils::getOperationName(local_600->m_op);
    sVar14 = strlen(pcVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,pcVar12,sVar14);
    poVar20 = local_610;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610," ",1);
    break;
  default:
    goto switchD_010a9edb_default;
  }
  poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar20,*(char **)psVar37,*(long *)(psVar37 + 8));
  lVar34 = 2;
LAB_010aa6ab:
  std::__ostream_insert<char,std::char_traits<char>>(poVar19,local_548,lVar34);
switchD_010a9edb_default:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"\t",1);
  pcVar12 = "dEQP_FragColor";
  bVar39 = (local_600->super_ShaderRenderCase).m_isVertexCase != false;
  if (bVar39) {
    pcVar12 = "v_color";
  }
  lVar34 = 0xe;
  if (bVar39) {
    lVar34 = 7;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,pcVar12,lVar34);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610," = ",3);
  if (local_600->m_op - OP_PRE_INCREMENT < 4) {
    pSVar27 = (ShaderMatrixCase *)0x1bff9b7;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"vec4(",5);
    genGLSLMatToVec3Reduction_abi_cxx11_(&local_498,pSVar27,&local_604,"res");
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_610,local_498._M_dataplus._M_p,local_498._M_string_length)
    ;
    pcVar12 = ", 1.0) + vec4(";
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,", 1.0) + vec4(",0xe);
    genGLSLMatToVec3Reduction_abi_cxx11_
              (&local_5f0,(ShaderMatrixCase *)pcVar12,&local_604,"tmpValue");
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar19,local_5f0._M_dataplus._M_p,local_5f0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,", 0.0);\n",8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
      operator_delete(local_5f0._M_dataplus._M_p,local_5f0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    pSVar27 = (ShaderMatrixCase *)0x1bff9b7;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"vec4(",5);
    genGLSLMatToVec3Reduction_abi_cxx11_(&local_498,pSVar27,&local_604,"res");
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_610,local_498._M_dataplus._M_p,local_498._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,", 1.0);\n",8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"}\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  pSVar27 = local_600;
  std::__cxx11::string::operator=
            ((string *)&(local_600->super_ShaderRenderCase).m_vertShaderSource,(string *)&local_498)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&(pSVar27->super_ShaderRenderCase).m_fragShaderSource,(string *)&local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  this_00 = &(pSVar27->super_ShaderRenderCase).m_userAttribTransforms;
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::resize
            (this_00,4);
  pEVar5 = (EVP_PKEY_CTX *)
           (this_00->
           super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  ctx_00 = pEVar5;
  uVar25 = 0;
  do {
    local_468 = 0;
    uStack_460 = 0;
    local_478 = 0;
    uStack_470 = 0;
    local_498.field_2._M_allocated_capacity = 0;
    local_498.field_2._8_8_ = 0;
    local_498._M_dataplus._M_p = (pointer)0x0;
    local_498._M_string_length = 0;
    lVar34 = 0;
    psVar18 = &local_498;
    do {
      lVar24 = 0;
      do {
        *(undefined4 *)((long)&(psVar18->_M_dataplus)._M_p + lVar24) = 0;
        lVar24 = lVar24 + 0x10;
      } while (lVar24 != 0x40);
      lVar34 = lVar34 + 1;
      psVar18 = (string *)((long)&(psVar18->_M_dataplus)._M_p + 4);
    } while (lVar34 != 4);
    lVar34 = 0;
    psVar18 = &local_498;
    pEVar31 = ctx_00;
    do {
      lVar24 = 0;
      do {
        *(undefined4 *)(pEVar31 + lVar24) =
             *(undefined4 *)((long)&(psVar18->_M_dataplus)._M_p + lVar24);
        lVar24 = lVar24 + 0x10;
      } while (lVar24 != 0x40);
      lVar34 = lVar34 + 1;
      pEVar31 = pEVar31 + 4;
      psVar18 = (string *)((long)&(psVar18->_M_dataplus)._M_p + 4);
    } while (lVar34 != 4);
    *(undefined8 *)(pEVar5 + uVar25 * 0x40 + 0x30) = 0x3dcccccd3e4ccccd;
    *(float *)(pEVar5 + uVar25 * 0x40 + 0x38) = (float)(int)uVar25 * 0.15 + 0.4;
    *(undefined4 *)(pEVar5 + uVar25 * 0x40 + 0x3c) = 0x3f333333;
    *(undefined4 *)(pEVar5 + uVar25 * 0x44) = 0x3f800000;
    uVar33 = uVar25 + 1;
    *(undefined4 *)(pEVar5 + (ulong)((uint)uVar33 & 3) * 4 + uVar25 * 0x40 + 0x10) = 0x3f800000;
    *(undefined4 *)(pEVar5 + (uVar25 & 0xffffffff ^ 2) * 4 + uVar25 * 0x40 + 0x20) = 0x3f800000;
    *(undefined4 *)(pEVar5 + (ulong)((int)uVar25 - 1U & 3) * 4 + uVar25 * 0x40 + 0x30) = 0x3f800000;
    ctx_00 = ctx_00 + 0x40;
    uVar25 = uVar33;
  } while (uVar33 != 4);
  TVar11 = MatrixCaseUtils::getOperationTestMatrixType(local_600->m_op);
  if (TVar11 != TESTMATRIXTYPE_DEFAULT) {
    lVar34 = 0;
    ctx_00 = (EVP_PKEY_CTX *)0x0;
    do {
      lVar30 = 0;
      lVar24 = lVar34;
      do {
        pMVar6 = (this_00->
                 super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar32 = 0;
        do {
          switch(TVar11) {
          case TESTMATRIXTYPE_NEGATED:
            fVar40 = -*(float *)((long)(pMVar6->m_data).m_data[0].m_data + lVar32 + lVar24);
            break;
          case TESTMATRIXTYPE_INCREMENTED:
            fVar40 = *(float *)((long)(pMVar6->m_data).m_data[0].m_data + lVar32 + lVar24) + 0.3;
            break;
          case TESTMATRIXTYPE_DECREMENTED:
            fVar40 = *(float *)((long)(pMVar6->m_data).m_data[0].m_data + lVar32 + lVar24) + -0.3;
            break;
          case TESTMATRIXTYPE_NEGATED_INCREMENTED:
            fVar40 = 0.3 - *(float *)((long)(pMVar6->m_data).m_data[0].m_data + lVar32 + lVar24);
            break;
          case TESTMATRIXTYPE_INCREMENTED_LESS:
            fVar40 = *(float *)((long)(pMVar6->m_data).m_data[0].m_data + lVar32 + lVar24) + -0.1;
            break;
          default:
            goto switchD_010aaac3_default;
          }
          *(float *)((long)(pMVar6->m_data).m_data[0].m_data + lVar32 + lVar24) = fVar40;
switchD_010aaac3_default:
          lVar32 = lVar32 + 0x10;
        } while (lVar32 != 0x40);
        lVar30 = lVar30 + 1;
        lVar24 = lVar24 + 4;
      } while (lVar30 != 4);
      ctx_00 = ctx_00 + 1;
      lVar34 = lVar34 + 0x40;
    } while (ctx_00 != (EVP_PKEY_CTX *)&DAT_00000004);
  }
  deqp::gls::ShaderRenderCase::init(&local_600->super_ShaderRenderCase,ctx_00);
  if (local_4b8 != &local_4a8) {
    operator_delete(local_4b8,CONCAT71(uStack_4a7,local_4a8) + 1);
  }
  if (local_588 != &local_578) {
    operator_delete(local_588,CONCAT71(uStack_577,local_578) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_568);
  if (local_4d8 != &local_4c8) {
    operator_delete(local_4d8,CONCAT71(uStack_4c7,local_4c8) + 1);
  }
  if (local_4f8 != &local_4e8) {
    operator_delete(local_4f8,CONCAT71(uStack_4e7,local_4e8) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  iVar8 = std::ios_base::~ios_base((ios_base *)(local_320 + 0x70));
  return iVar8;
}

Assistant:

void ShaderMatrixCase::init (void)
{
	std::ostringstream	vtx;
	std::ostringstream	frag;
	std::ostringstream&	op				= m_isVertexCase ? vtx : frag;

	bool				isInDynMat0		= isDataTypeMatrix(m_in0.dataType) && m_in0.inputType == INPUTTYPE_DYNAMIC;
	bool				isInDynMat1		= isDataTypeMatrix(m_in1.dataType) && m_in1.inputType == INPUTTYPE_DYNAMIC;
	string				inValue0;
	string				inValue1;
	DataType			resultType		= TYPE_LAST;
	Precision			resultPrec		= m_in0.precision;
	vector<string>		passVars;
	int					numInputs		= (isOperationBinary(m_op)) ? (2) : (1);

	std::string			operationValue0;
	std::string			operationValue1;

	DE_ASSERT(!isInDynMat0 || !isInDynMat1); // Only single dynamic matrix input is allowed.
	DE_UNREF(isInDynMat0 && isInDynMat1);

	// Compute result type.
	if (m_op == OP_MUL && isDataTypeMatrix(m_in0.dataType) && isDataTypeMatrix(m_in1.dataType))
	{
		resultType = getDataTypeMatrix(getDataTypeMatrixNumColumns(m_in1.dataType), getDataTypeMatrixNumRows(m_in0.dataType));
	}
	else if (m_op == OP_OUTER_PRODUCT)
	{
		resultType = getDataTypeMatrix(getDataTypeScalarSize(m_in1.dataType), getDataTypeScalarSize(m_in0.dataType));
	}
	else if (m_op == OP_TRANSPOSE)
	{
		resultType = getDataTypeMatrix(getDataTypeMatrixNumRows(m_in0.dataType), getDataTypeMatrixNumColumns(m_in0.dataType));
	}
	else if (m_op == OP_INVERSE)
	{
		resultType = m_in0.dataType;
	}
	else if (m_op == OP_DETERMINANT)
	{
		resultType = TYPE_FLOAT;
	}
	else if (getOperationType(m_op) == OPERATIONTYPE_UNARY_PREFIX_OPERATOR ||
			 getOperationType(m_op) == OPERATIONTYPE_UNARY_POSTFIX_OPERATOR)
	{
		resultType = m_in0.dataType;
	}
	else if (isDataTypeMatrix(m_in0.dataType) && isDataTypeMatrix(m_in1.dataType))
	{
		DE_ASSERT(m_in0.dataType == m_in1.dataType);
		resultType = m_in0.dataType;
	}
	else if (isDataTypeMatrix(m_in0.dataType) || isDataTypeMatrix(m_in1.dataType))
	{
		int			matNdx		= isDataTypeMatrix(m_in0.dataType) ? 0 : 1;
		DataType	matrixType	= matNdx == 0 ? m_in0.dataType : m_in1.dataType;
		DataType	otherType	= matNdx == 0 ? m_in1.dataType : m_in0.dataType;

		if (otherType == TYPE_FLOAT)
			resultType = matrixType;
		else
		{
			DE_ASSERT(isDataTypeVector(otherType));
			resultType = getDataTypeFloatVec(matNdx == 0 ? getDataTypeMatrixNumRows(matrixType) : getDataTypeMatrixNumColumns(matrixType));
		}
	}
	else
	{
		DE_ASSERT(DE_FALSE);
	}

	vtx << "#version 300 es\n";
	frag << "#version 300 es\n";

	vtx << "in highp vec4 a_position;\n";
	frag << "layout(location = 0) out mediump vec4 dEQP_FragColor;\n";
	if (m_isVertexCase)
	{
		vtx << "out mediump vec4 v_color;\n";
		frag << "in mediump vec4 v_color;\n";
	}

	// Input declarations.
	for (int inNdx = 0; inNdx < numInputs; inNdx++)
	{
		const ShaderInput&	in			= inNdx > 0 ? m_in1 : m_in0;
		const char*			precName	= getPrecisionName(in.precision);
		const char*			typeName	= getDataTypeName(in.dataType);
		string&				inValue		= inNdx > 0 ? inValue1 : inValue0;

		if (in.inputType == INPUTTYPE_DYNAMIC)
		{
			vtx << "in " << precName << " " << typeName << " a_";

			if (isDataTypeMatrix(in.dataType))
			{
				// a_matN, v_matN
				vtx << typeName << ";\n";
				if (!m_isVertexCase)
				{
					vtx << "out " << precName << " " << typeName << " v_" << typeName << ";\n";
					frag << "in " << precName << " " << typeName << " v_" << typeName << ";\n";
					passVars.push_back(typeName);
				}

				inValue = string(m_isVertexCase ? "a_" : "v_") + getDataTypeName(in.dataType);
			}
			else
			{
				// a_coords, v_coords
				vtx << "coords;\n";
				if (!m_isVertexCase)
				{
					vtx << "out " << precName << " " << typeName << " v_coords;\n";
					frag << "in " << precName << " " << typeName << " v_coords;\n";
					passVars.push_back("coords");
				}

				inValue = m_isVertexCase ? "a_coords" : "v_coords";
			}
		}
		else if (in.inputType == INPUTTYPE_UNIFORM)
		{
			op << "uniform " << precName << " " << typeName << " u_in" << inNdx << ";\n";
			inValue = string("u_in") + de::toString(inNdx);
		}
		else if (in.inputType == INPUTTYPE_CONST)
		{
			op << "const " << precName << " " << typeName << " in" << inNdx << " = ";

			// Generate declaration.
			switch (in.dataType)
			{
				case TYPE_FLOAT:		op << de::floatToString(s_constInFloat[inNdx], 1);					break;
				case TYPE_FLOAT_VEC2:	writeVectorConstructor<2>(op, s_constInVec2[inNdx]);				break;
				case TYPE_FLOAT_VEC3:	writeVectorConstructor<3>(op, s_constInVec3[inNdx]);				break;
				case TYPE_FLOAT_VEC4:	writeVectorConstructor<4>(op, s_constInVec4[inNdx]);				break;
				case TYPE_FLOAT_MAT2:	writeMatrixConstructor<2, 2>(op, Mat2(s_constInMat2x2[inNdx]));		break;
				case TYPE_FLOAT_MAT2X3:	writeMatrixConstructor<2, 3>(op, Mat2x3(s_constInMat2x3[inNdx]));	break;
				case TYPE_FLOAT_MAT2X4:	writeMatrixConstructor<2, 4>(op, Mat2x4(s_constInMat2x4[inNdx]));	break;
				case TYPE_FLOAT_MAT3X2:	writeMatrixConstructor<3, 2>(op, Mat3x2(s_constInMat3x2[inNdx]));	break;
				case TYPE_FLOAT_MAT3:	writeMatrixConstructor<3, 3>(op, Mat3(s_constInMat3x3[inNdx]));		break;
				case TYPE_FLOAT_MAT3X4:	writeMatrixConstructor<3, 4>(op, Mat3x4(s_constInMat3x4[inNdx]));	break;
				case TYPE_FLOAT_MAT4X2:	writeMatrixConstructor<4, 2>(op, Mat4x2(s_constInMat4x2[inNdx]));	break;
				case TYPE_FLOAT_MAT4X3:	writeMatrixConstructor<4, 3>(op, Mat4x3(s_constInMat4x3[inNdx]));	break;
				case TYPE_FLOAT_MAT4:	writeMatrixConstructor<4, 4>(op, Mat4(s_constInMat4x4[inNdx]));		break;

				default:
					DE_ASSERT(DE_FALSE);
			}

			op << ";\n";

			inValue = string("in") + de::toString(inNdx);
		}
	}

	vtx << "\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	gl_Position = a_position;\n";
	frag << "\n"
		 << "void main (void)\n"
		 << "{\n";

	if (m_isVertexCase)
		frag << "	dEQP_FragColor = v_color;\n";
	else
	{
		for (vector<string>::const_iterator copyIter = passVars.begin(); copyIter != passVars.end(); copyIter++)
			vtx << "	v_" << *copyIter << " = " << "a_" << *copyIter << ";\n";
	}

	// Operation.

	switch (getOperationNature(m_op))
	{
		case OPERATIONNATURE_PURE:
			DE_ASSERT(getOperationType(m_op) != OPERATIONTYPE_ASSIGNMENT);

			operationValue0 = inValue0;
			operationValue1 = inValue1;
			break;

		case OPERATIONNATURE_MUTATING:
			DE_ASSERT(getOperationType(m_op) != OPERATIONTYPE_ASSIGNMENT);

			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " tmpValue = " << inValue0 << ";\n";

			operationValue0 = "tmpValue";
			operationValue1 = inValue1;
			break;

		case OPERATIONNATURE_ASSIGNMENT:
			DE_ASSERT(getOperationType(m_op) == OPERATIONTYPE_ASSIGNMENT);

			operationValue0 = inValue0;
			operationValue1 = inValue1;
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}

	switch (getOperationType(m_op))
	{
		case OPERATIONTYPE_BINARY_OPERATOR:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << operationValue0 << " " << getOperationName(m_op) << " " << operationValue1 << ";\n";
			break;

		case OPERATIONTYPE_UNARY_PREFIX_OPERATOR:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << getOperationName(m_op) << operationValue0 << ";\n";
			break;

		case OPERATIONTYPE_UNARY_POSTFIX_OPERATOR:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << operationValue0 << getOperationName(m_op) << ";\n";
			break;

		case OPERATIONTYPE_BINARY_FUNCTION:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << getOperationName(m_op) << "(" << operationValue0 << ", " << operationValue1 << ");\n";
			break;

		case OPERATIONTYPE_UNARY_FUNCTION:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << getOperationName(m_op) << "(" << operationValue0 << ");\n";
			break;

		case OPERATIONTYPE_ASSIGNMENT:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << operationValue0 << ";\n";
			op << "	res " << getOperationName(m_op) << " " << operationValue1 << ";\n";
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}

	// Reduction to vec3 (rgb). Check the used value too if it was modified
	op << "	" << (m_isVertexCase ? "v_color" : "dEQP_FragColor") << " = ";

	if (isOperationValueModifying(m_op))
		op << "vec4(" << genGLSLMatToVec3Reduction(resultType, "res") << ", 1.0) + vec4(" << genGLSLMatToVec3Reduction(resultType, "tmpValue") << ", 0.0);\n";
	else
		op << "vec4(" << genGLSLMatToVec3Reduction(resultType, "res") << ", 1.0);\n";

	vtx << "}\n";
	frag << "}\n";

	m_vertShaderSource	= vtx.str();
	m_fragShaderSource	= frag.str();

	// \todo [2012-02-14 pyry] Compute better values for matrix tests.
	m_userAttribTransforms.resize(4);
	for (int attribNdx = 0; attribNdx < 4; attribNdx++)
	{
		m_userAttribTransforms[attribNdx] = Mat4(0.0f);
		m_userAttribTransforms[attribNdx](                  0, 3) = 0.2f;								// !< prevent matrix*vec from going into zero (assuming vec.w != 0)
		m_userAttribTransforms[attribNdx](                  1, 3) = 0.1f;								// !<
		m_userAttribTransforms[attribNdx](                  2, 3) = 0.4f + 0.15f * float(attribNdx);	// !<
		m_userAttribTransforms[attribNdx](                  3, 3) = 0.7f;								// !<
		m_userAttribTransforms[attribNdx]((0 + attribNdx) % 4, 0) = 1.0f;
		m_userAttribTransforms[attribNdx]((1 + attribNdx) % 4, 1) = 1.0f;
		m_userAttribTransforms[attribNdx]((2 + attribNdx) % 4, 2) = 1.0f;
		m_userAttribTransforms[attribNdx]((3 + attribNdx) % 4, 3) = 1.0f;
	}

	// prevent bad reference cases such as black result images by fine-tuning used matrices
	if (getOperationTestMatrixType(m_op) != TESTMATRIXTYPE_DEFAULT)
	{
		for (int attribNdx = 0; attribNdx < 4; attribNdx++)
		{
			for (int row = 0; row < 4; row++)
			for (int col = 0; col < 4; col++)
			{
				switch (getOperationTestMatrixType(m_op))
				{
					case TESTMATRIXTYPE_NEGATED:
						m_userAttribTransforms[attribNdx](row, col) = -m_userAttribTransforms[attribNdx](row, col);
						break;
					case TESTMATRIXTYPE_INCREMENTED:
						m_userAttribTransforms[attribNdx](row, col) += 0.3f;
						break;
					case TESTMATRIXTYPE_DECREMENTED:
						m_userAttribTransforms[attribNdx](row, col) -= 0.3f;
						break;
					case TESTMATRIXTYPE_NEGATED_INCREMENTED:
						m_userAttribTransforms[attribNdx](row, col) = -m_userAttribTransforms[attribNdx](row, col) + 0.3f;
						break;
					case TESTMATRIXTYPE_INCREMENTED_LESS:
						m_userAttribTransforms[attribNdx](row, col) -= 0.1f;
						break;

					default:
						DE_ASSERT(DE_FALSE);
						break;
				}
			}
		}
	}

	ShaderRenderCase::init();
}